

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O0

bool __thiscall
ON_CompressedBuffer::Write(ON_CompressedBuffer *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  size_t local_40;
  bool local_21;
  bool rc;
  ON_BinaryArchive *binary_archive_local;
  ON_CompressedBuffer *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(binary_archive,0x40008000,1,0);
  if (bVar1) {
    local_21 = ON_BinaryArchive::WriteSize(binary_archive,this->m_sizeof_uncompressed);
    if (local_21) {
      if ((this->m_buffer_compressed == (void *)0x0) || (this->m_sizeof_compressed == 0)) {
        local_40 = 0;
      }
      else {
        local_40 = this->m_sizeof_compressed;
      }
      local_21 = ON_BinaryArchive::WriteSize(binary_archive,local_40);
      if ((((local_21) &&
           (local_21 = ON_BinaryArchive::WriteInt(binary_archive,this->m_crc_uncompressed), local_21
           )) && (local_21 = ON_BinaryArchive::WriteInt(binary_archive,this->m_crc_compressed),
                 local_21)) &&
         (((local_21 = ON_BinaryArchive::WriteInt(binary_archive,this->m_method), local_21 &&
           (local_21 = ON_BinaryArchive::WriteInt(binary_archive,this->m_sizeof_element), local_21))
          && ((this->m_buffer_compressed != (void *)0x0 && (this->m_sizeof_compressed != 0)))))) {
        local_21 = ON_BinaryArchive::WriteByte
                             (binary_archive,this->m_sizeof_compressed,this->m_buffer_compressed);
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(binary_archive);
    if (!bVar1) {
      local_21 = false;
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_CompressedBuffer::Write( ON_BinaryArchive& binary_archive ) const
{
  bool rc = binary_archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if ( !rc )
    return false;

  for(;;)
  {
#pragma ON_PRAGMA_WARNING_PUSH
#pragma ON_PRAGMA_WARNING_DISABLE_MSC(4996)
#pragma ON_PRAGMA_WARNING_DISABLE_CLANG("-Wdeprecated-declarations")
    rc = binary_archive.WriteSize(m_sizeof_uncompressed);
    if (!rc)
      break;
    rc = binary_archive.WriteSize((m_buffer_compressed && m_sizeof_compressed>0) ? m_sizeof_compressed : 0);
    if (!rc)
      break;
#pragma ON_PRAGMA_WARNING_POP
    rc = binary_archive.WriteInt(m_crc_uncompressed);
    if (!rc)
      break;
    rc = binary_archive.WriteInt(m_crc_compressed);
    if (!rc)
      break;
    rc = binary_archive.WriteInt(m_method);
    if (!rc)
      break;
    rc = binary_archive.WriteInt(m_sizeof_element);
    if (!rc)
      break;
    if ( m_buffer_compressed && m_sizeof_compressed > 0 )
    {
      rc = binary_archive.WriteByte(m_sizeof_compressed,m_buffer_compressed);
      if (!rc)
        break;
    }
    break;
  }

  if ( !binary_archive.EndWrite3dmChunk() )
    rc = false;

  return rc;
}